

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufq.c
# Opt level: O3

ssize_t Curl_bufq_write(bufq *q,uchar *buf,size_t len,CURLcode *err)

{
  buf_chunk *pbVar1;
  CURLcode CVar2;
  ulong uVar3;
  ulong uVar4;
  ulong __n;
  
  if (len == 0) {
    CVar2 = CURLE_OK;
    uVar4 = 0;
  }
  else {
    uVar3 = 0;
    do {
      pbVar1 = get_non_full_tail(q);
      if (pbVar1 == (buf_chunk *)0x0) {
        uVar4 = 0xffffffffffffffff;
        CVar2 = CURLE_OUT_OF_MEMORY;
        if ((q->max_chunks <= q->chunk_count) && ((q->opts & 1) == 0)) {
LAB_00112526:
          CVar2 = CURLE_AGAIN;
          if (uVar3 != 0) {
            CVar2 = CURLE_OK;
          }
          uVar4 = -(ulong)(uVar3 == 0) | uVar3;
        }
        goto LAB_0011253d;
      }
      __n = pbVar1->dlen - pbVar1->w_offset;
      if (__n == 0) goto LAB_00112526;
      if (len <= __n) {
        __n = len;
      }
      memcpy((void *)((long)&pbVar1->x + pbVar1->w_offset),buf,__n);
      pbVar1->w_offset = pbVar1->w_offset + __n;
      uVar4 = uVar3 + __n;
      buf = buf + __n;
      len = len - __n;
      uVar3 = uVar4;
    } while (len != 0);
    CVar2 = CURLE_OK;
  }
LAB_0011253d:
  *err = CVar2;
  return uVar4;
}

Assistant:

ssize_t Curl_bufq_write(struct bufq *q,
                        const unsigned char *buf, size_t len,
                        CURLcode *err)
{
  struct buf_chunk *tail;
  ssize_t nwritten = 0;
  size_t n;

  DEBUGASSERT(q->max_chunks > 0);
  while(len) {
    tail = get_non_full_tail(q);
    if(!tail) {
      if((q->chunk_count < q->max_chunks) || (q->opts & BUFQ_OPT_SOFT_LIMIT)) {
        *err = CURLE_OUT_OF_MEMORY;
        return -1;
      }
      break;
    }
    n = chunk_append(tail, buf, len);
    if(!n)
      break;
    nwritten += n;
    buf += n;
    len -= n;
  }
  if(nwritten == 0 && len) {
    *err = CURLE_AGAIN;
    return -1;
  }
  *err = CURLE_OK;
  return nwritten;
}